

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,ExpressionList *expression_list)

{
  pointer ppEVar1;
  char cVar2;
  int iVar3;
  Expression **expression;
  pointer ppEVar4;
  
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->stream_,"ExpressionList: ",0x10);
  cVar2 = (char)&this->stream_;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->stream_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  iVar3 = this->num_tabs_;
  this->num_tabs_ = iVar3 + 1;
  ppEVar4 = (expression_list->expressions_).
            super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (expression_list->expressions_).
            super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar4 != ppEVar1) {
    do {
      (*((*ppEVar4)->super_BaseElement)._vptr_BaseElement[2])(*ppEVar4,this);
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 != ppEVar1);
    iVar3 = this->num_tabs_ + -1;
  }
  this->num_tabs_ = iVar3;
  return;
}

Assistant:

void PrintVisitor::Visit(ExpressionList* expression_list) {
  PrintTabs();
  stream_ << "ExpressionList: " << std::endl;

  ++num_tabs_;
  for (auto&& expression : expression_list->expressions_) {
    expression->Accept(this);
  }
  --num_tabs_;
}